

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall Js::InterpreterStackFrame::OP_NewScObjectSimple(InterpreterStackFrame *this)

{
  bool bVar1;
  DynamicObject *obj;
  RecyclableObject *pRVar2;
  
  obj = JavascriptLibrary::CreateObject(*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),true,0);
  bVar1 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar1) {
    pRVar2 = JavascriptProxy::AutoProxyWrapper(obj);
    return pRVar2;
  }
  return obj;
}

Assistant:

Var InterpreterStackFrame::OP_NewScObjectSimple()
    {
        Var object = scriptContext->GetLibrary()->CreateObject(true);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            object = JavascriptProxy::AutoProxyWrapper(object);
        }
#endif
        return object;
    }